

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

void squall::detail::
     defun<2,void,std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&>
               (HSQUIRRELVM vm,string *name,
               function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *f,string *argtypemask)

{
  SQFUNCTION unaff_RBP;
  HSQUIRRELVM unaff_retaddr;
  SQChar *in_stack_00000018;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  HSQUIRRELVM name_00;
  string *argtypemask_local;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_local;
  string *name_local;
  HSQUIRRELVM vm_local;
  
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  sq_pushstring(vm,(SQChar *)name,(SQInteger)f);
  construct_object<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
            (vm,f);
  sq_newclosure(unaff_retaddr,unaff_RBP,(SQUnsignedInteger)vm);
  name_00 = vm;
  std::__cxx11::string::c_str();
  sq_setparamscheck(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::c_str();
  sq_setnativeclosurename((HSQUIRRELVM)argtypemask,(SQInteger)vm,(SQChar *)name_00);
  sq_newslot((HSQUIRRELVM)name,(SQInteger)f,(SQBool)argtypemask);
  return;
}

Assistant:

void defun(
    HSQUIRRELVM vm,
    const string& name,
    const std::function<R (T...)>& f,
    const string& argtypemask) {

    sq_pushstring(vm, name.data(), name.length());
    construct_object(vm, f);
    sq_newclosure(vm, stub<Offset, std::function<R (T...)>>, 1);
    sq_setparamscheck(vm, SQ_MATCHTYPEMASKSTRING, argtypemask.c_str());
    sq_setnativeclosurename(vm, -1, name.c_str());
    sq_newslot(vm, -3, SQFalse);
}